

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O0

void DeleteAuthCookie(void)

{
  long in_FS_OFFSET;
  filesystem_error *e;
  path *in_stack_ffffffffffffff48;
  bool in_stack_ffffffffffffff7f;
  path local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (g_generated_cookie) {
    GetAuthCookieFile(in_stack_ffffffffffffff7f);
    std::filesystem::remove(&local_30);
    fs::path::~path(in_stack_ffffffffffffff48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DeleteAuthCookie()
{
    try {
        if (g_generated_cookie) {
            // Delete the cookie file if it was generated by this process
            fs::remove(GetAuthCookieFile());
        }
    } catch (const fs::filesystem_error& e) {
        LogPrintf("%s: Unable to remove random auth cookie file: %s\n", __func__, fsbridge::get_filesystem_error_message(e));
    }
}